

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O0

int __thiscall
Centaurus::LookaheadDFA<wchar_t>::add_state(LookaheadDFA<wchar_t> *this,CATNClosure *label)

{
  bool bVar1;
  size_type sVar2;
  NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
  *this_00;
  set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
  *__y;
  uint local_24;
  uint i;
  CATNClosure *label_local;
  LookaheadDFA<wchar_t> *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::
            vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>::
            size(&(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states);
    if (sVar2 <= local_24) {
      std::vector<Centaurus::LDFAState<wchar_t>,std::allocator<Centaurus::LDFAState<wchar_t>>>::
      emplace_back<std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>const&>
                ((vector<Centaurus::LDFAState<wchar_t>,std::allocator<Centaurus::LDFAState<wchar_t>>>
                  *)&(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states,label);
      sVar2 = std::
              vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
              ::size(&(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states);
      return (int)sVar2 + -1;
    }
    this_00 = &std::
               vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
               ::operator[](&(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states,
                            (ulong)local_24)->
               super_NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
    ;
    __y = NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
          ::label(this_00);
    bVar1 = std::operator==(label,__y);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int add_state(const CATNClosure& label)
	{
		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			if (label == m_states[i].label())
			{
				return i;
			}
		}
		m_states.emplace_back(label);
		return m_states.size() - 1;
	}